

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

int32_t utrie_swapAnyVersion_63
                  (UDataSwapper *ds,void *inData,int32_t length,void *outData,UErrorCode *pErrorCode
                  )

{
  int iVar1;
  uint uVar2;
  int32_t iVar3;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return 0;
  }
  uVar2 = 0;
  if (((ulong)inData & 3) == 0 && (inData != (void *)0x0 && 0xf < length)) {
    iVar1 = *inData;
    uVar2 = 3;
    if (iVar1 < 0x54726933) {
      if (iVar1 == 0x32697254) {
LAB_002dd385:
        iVar3 = utrie2_swap_63(ds,inData,length,outData,pErrorCode);
        return iVar3;
      }
      if (iVar1 == 0x33697254) goto LAB_002dd34b;
      if (iVar1 == 0x54726932) goto LAB_002dd385;
    }
    else {
      if (iVar1 == 0x54726933) goto LAB_002dd34b;
      if ((iVar1 == 0x54726965) || (iVar1 == 0x65697254)) {
        iVar3 = utrie_swap_63(ds,inData,length,outData,pErrorCode);
        return iVar3;
      }
    }
    uVar2 = 0;
  }
LAB_002dd34b:
  iVar3 = (*(code *)((long)&DAT_0033d964 + (long)(int)(&DAT_0033d964)[uVar2]))();
  return iVar3;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }